

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O0

void __thiscall OpenMD::GB::GB(GB *this)

{
  undefined8 *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  VanDerWaalsInteraction *in_stack_ffffffffffffffd0;
  allocator<char> local_9 [9];
  
  VanDerWaalsInteraction::VanDerWaalsInteraction(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__GB_00565aa0;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::allocator<char>::~allocator(local_9);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x44b9c0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x44b9cd);
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
            *)0x44b9da);
  in_RDI[0x13] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x44b9f5);
  in_RDI[0x1a] = 0x4000000000000000;
  in_RDI[0x1b] = 0x3ff0000000000000;
  return;
}

Assistant:

GB::GB() :
      initialized_(false), name_("GB"), forceField_(NULL), mu_(2.0), nu_(1.0) {}